

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

ostream * __thiscall dynamicgraph::Entity::writeCompletionList(Entity *this,ostream *os)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  string local_50;
  
  for (p_Var2 = (this->signalMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      &(this->signalMap)._M_t._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var2;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(os,(string *)&this->name);
    poVar1 = std::operator<<(poVar1,".");
    SignalBase<int>::shortName_abi_cxx11_(&local_50,*(SignalBase<int> **)(p_Var2 + 2));
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_50);
  }
  poVar1 = std::operator<<(os,(string *)&Entity_COMMAND_LIST_abi_cxx11_);
  std::endl<char,std::char_traits<char>>(poVar1);
  return os;
}

Assistant:

std::ostream &Entity::writeCompletionList(std::ostream &os) const {
  const SignalMap::const_iterator iterend = signalMap.end();
  for (SignalMap::const_iterator iter = signalMap.begin(); iterend != iter;
       ++iter) {
    os << getName() << "." << (*(iter->second)).shortName() << std::endl;
  }

  os << getCommandList() << std::endl;
  return os;
}